

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreewidget.cpp
# Opt level: O2

void __thiscall
QTreeWidgetItem::insertChildren(QTreeWidgetItem *this,int index,QList<QTreeWidgetItem_*> *children)

{
  parameter_type t;
  bool bVar1;
  QTreeModel *this_00;
  value_type pQVar2;
  QTreeWidgetItem *pQVar3;
  QTreeWidgetItemPrivate *this_01;
  int c;
  int n;
  ulong uVar4;
  long lVar5;
  long in_FS_OFFSET;
  QArrayDataPointer<QTreeWidgetItem_*> local_78;
  QArrayDataPointer<QTreeWidgetItem_*> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (((-1 < index) && ((ulong)(uint)index <= (ulong)(this->children).d.size)) &&
     ((children->d).size != 0)) {
    if ((&this->view->super_QTreeView == (QTreeView *)0x0) ||
       (bVar1 = QTreeView::isSortingEnabled(&this->view->super_QTreeView), !bVar1)) {
      this_00 = treeModel(this,(QTreeWidget *)0x0);
      local_58.d = (Data *)0x0;
      local_58.ptr = (QTreeWidgetItem **)0x0;
      local_58.size = 0;
      local_78.d = (Data *)0x0;
      local_78.ptr = (QTreeWidgetItem **)0x0;
      local_78.size = 0;
      for (uVar4 = 0; uVar4 < (ulong)(children->d).size; uVar4 = uVar4 + 1) {
        t = (children->d).ptr[uVar4];
        if ((t->view == (QTreeWidget *)0x0) && (t->par == (QTreeWidgetItem *)0x0)) {
          QList<QTreeWidgetItem_*>::append((QList<QTreeWidgetItem_*> *)&local_78,t);
          pQVar3 = this;
          if (this->view == (QTreeWidget *)0x0 || this_00 == (QTreeModel *)0x0) {
            if (this_00 != (QTreeModel *)0x0) goto LAB_00550a4a;
          }
          else {
            if ((int)(t->children).d.size == 0) {
              t->view = this->view;
            }
            else {
              QList<QTreeWidgetItem_*>::append((QList<QTreeWidgetItem_*> *)&local_58,t);
            }
LAB_00550a4a:
            if (this_00->rootItem == this) {
              pQVar3 = (QTreeWidgetItem *)0x0;
            }
          }
          t->par = pQVar3;
        }
      }
      if (local_78.size != 0) {
        while (local_58.size != 0) {
          pQVar2 = QList<QTreeWidgetItem_*>::takeLast((QList<QTreeWidgetItem_*> *)&local_58);
          pQVar2->view = this->view;
          lVar5 = 0;
          for (uVar4 = 0; uVar4 < (ulong)(pQVar2->children).d.size; uVar4 = uVar4 + 1) {
            QStack<QTreeWidgetItem_*>::push
                      ((QStack<QTreeWidgetItem_*> *)&local_58,
                       (QTreeWidgetItem **)((long)(pQVar2->children).d.ptr + lVar5));
            lVar5 = lVar5 + 8;
          }
        }
        if (this_00 != (QTreeModel *)0x0) {
          QTreeModel::beginInsertItems(this_00,this,index,(int)local_78.size);
        }
        for (uVar4 = 0; uVar4 < (ulong)local_78.size; uVar4 = uVar4 + 1) {
          pQVar3 = local_78.ptr[uVar4];
          this_01 = (QTreeWidgetItemPrivate *)&this->children;
          QList<QTreeWidgetItem_*>::insert(&this->children,(uint)index + uVar4,pQVar3);
          if (pQVar3->par != (QTreeWidgetItem *)0x0) {
            QTreeWidgetItemPrivate::propagateDisabled(this_01,pQVar3);
          }
          QTreeWidgetItemPrivate::updateHiddenStatus(this_01,pQVar3,true);
        }
        if (this_00 != (QTreeModel *)0x0) {
          QAbstractItemModel::endInsertRows();
        }
      }
      QArrayDataPointer<QTreeWidgetItem_*>::~QArrayDataPointer(&local_78);
      QArrayDataPointer<QTreeWidgetItem_*>::~QArrayDataPointer(&local_58);
    }
    else {
      for (uVar4 = 0; uVar4 < (ulong)(children->d).size; uVar4 = uVar4 + 1) {
        insertChild(this,index,(children->d).ptr[uVar4]);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTreeWidgetItem::insertChildren(int index, const QList<QTreeWidgetItem*> &children)
{
    if (index < 0 || index > this->children.size() || children.isEmpty())
        return;

    if (view && view->isSortingEnabled()) {
        for (int n = 0; n < children.size(); ++n)
            insertChild(index, children.at(n));
        return;
    }
    QTreeModel *model = treeModel();
    QStack<QTreeWidgetItem*> stack;
    QList<QTreeWidgetItem*> itemsToInsert;
    for (int n = 0; n < children.size(); ++n) {
        QTreeWidgetItem *child = children.at(n);
        if (child->view || child->par)
            continue;
        itemsToInsert.append(child);
        if (view && model) {
            if (child->childCount() == 0)
                child->view = view;
            else
                stack.push(child);
        }
        if (model && (model->rootItem == this))
            child->par = nullptr;
        else
            child->par = this;
    }
    if (!itemsToInsert.isEmpty()) {
        while (!stack.isEmpty()) {
            QTreeWidgetItem *i = stack.pop();
            i->view = view;
            for (int c = 0; c < i->children.size(); ++c)
                stack.push(i->children.at(c));
        }
        if (model) model->beginInsertItems(this, index, itemsToInsert.size());
        for (int n = 0; n < itemsToInsert.size(); ++n) {
            QTreeWidgetItem *child = itemsToInsert.at(n);
            this->children.insert(index + n, child);
            if (child->par)
                d->propagateDisabled(child);
            d->updateHiddenStatus(child, true);
        }
        if (model) model->endInsertItems();
    }
}